

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

Expression * soul::ExpressionHelpers::createPrimitive(Expression *__return_storage_ptr__,string *s)

{
  Section local_60;
  string *local_18;
  string *s_local;
  
  local_60.type = primitive;
  local_18 = s;
  s_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_60.text,(string *)s);
  std::__cxx11::string::string((string *)&local_60.referencedUID);
  fromSection(__return_storage_ptr__,&local_60);
  SourceCodeModel::Expression::Section::~Section(&local_60);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression createPrimitive    (std::string s) { return fromSection ({ SourceCodeModel::Expression::Section::Type::primitive,  std::move (s) }); }